

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

int TVMStreamStreamSynchronize
              (int device_type,int device_id,TVMStreamHandle src,TVMStreamHandle dst)

{
  DeviceAPI *pDVar1;
  runtime_error *_except_;
  TVMContext local_30;
  TVMContext ctx;
  TVMStreamHandle dst_local;
  TVMStreamHandle src_local;
  int device_id_local;
  int device_type_local;
  
  local_30.device_type = device_type;
  local_30.device_id = device_id;
  ctx = (TVMContext)dst;
  pDVar1 = tvm::runtime::DeviceAPIManager::Get(&local_30);
  (*pDVar1->_vptr_DeviceAPI[0xb])(pDVar1,CONCAT44(local_30.device_id,local_30.device_type),src,ctx);
  return 0;
}

Assistant:

int TVMStreamStreamSynchronize(int device_type,
                               int device_id,
                               TVMStreamHandle src,
                               TVMStreamHandle dst) {
  API_BEGIN();
  TVMContext ctx;
  ctx.device_type = static_cast<DLDeviceType>(device_type);
  ctx.device_id = device_id;
  DeviceAPIManager::Get(ctx)->SyncStreamFromTo(ctx, src, dst);
  API_END();
}